

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexHull.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChConvexHull2D::ComputeGraham
          (ChConvexHull2D *this,
          vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_> *points,
          size_t n)

{
  __normal_iterator<chrono::ChVector2<double>_*,_std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
  __first;
  __normal_iterator<chrono::ChVector2<double>_*,_std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
  __last;
  pointer pCVar1;
  double dVar2;
  ulong uVar3;
  pointer pCVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  _Iter_comp_iter<chrono::utils::PolarOrder> local_30;
  _Iter_comp_iter<chrono::utils::PolarOrder> local_20;
  
  __last._M_current =
       (points->
       super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  pCVar1 = (points->
           super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)__last._M_current - (long)pCVar1 >> 4;
  if (uVar3 < 2) {
    dVar9 = pCVar1->m_data[0];
    dVar10 = pCVar1->m_data[1];
    pCVar4 = pCVar1;
  }
  else {
    pdVar5 = pCVar1[1].m_data + 1;
    uVar6 = 1;
    uVar7 = 0;
    do {
      dVar9 = *pdVar5 - pCVar1[uVar7].m_data[1];
      uVar8 = uVar6;
      if ((((0.0 <= dVar9) && (uVar8 = uVar7, dVar9 == 0.0)) && (!NAN(dVar9))) &&
         (((ChVector2<double> *)(pdVar5 + -1))->m_data[0] < pCVar1[uVar7].m_data[0])) {
        uVar8 = uVar6;
      }
      uVar6 = uVar6 + 1;
      pdVar5 = pdVar5 + 2;
      uVar7 = uVar8;
    } while (uVar3 != uVar6);
    dVar9 = pCVar1->m_data[0];
    dVar10 = pCVar1->m_data[1];
    pCVar4 = pCVar1 + uVar8;
    if (uVar8 != 0) {
      dVar2 = pCVar4->m_data[1];
      pCVar1->m_data[0] = pCVar4->m_data[0];
      pCVar1->m_data[1] = dVar2;
    }
  }
  __first._M_current = pCVar1 + 1;
  pCVar4->m_data[0] = dVar9;
  pCVar4->m_data[1] = dVar10;
  if (__first._M_current != __last._M_current) {
    dVar9 = pCVar1->m_data[0];
    dVar10 = pCVar1->m_data[1];
    local_20._M_comp.m_pivot.m_data[0] = dVar9;
    local_20._M_comp.m_pivot.m_data[1] = dVar10;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<chrono::ChVector2<double>*,std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<chrono::utils::PolarOrder>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 4) *
                            2) ^ 0x7e,&local_20);
    local_30._M_comp.m_pivot.m_data[0] = dVar9;
    local_30._M_comp.m_pivot.m_data[1] = dVar10;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<chrono::ChVector2<double>*,std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<chrono::utils::PolarOrder>>
              (__first,__last,&local_30);
  }
  return;
}

Assistant:

void ChConvexHull2D::ComputeGraham(std::vector<ChVector2<>>& points, size_t n) {
    // Find point with lowest y. Ties are broken for lowest x.
    size_t first = 0;
    for (size_t i = 1; i < points.size(); i++) {
        double dy = points[i].y() - points[first].y();
        if (dy < 0)
            first = i;
        else if (dy == 0 && points[i].x() < points[first].x())
            first = i;
    }

    // Swap this point in first position
    ChVector2<> tmp = points[0];
    points[0] = points[first];
    points[first] = tmp;

    // Sort the remaining points by polar order about the pivot.
    size_t pivot = 0;
    std::sort(std::next(points.begin()), points.end(), PolarOrder(points[pivot]));

    // Graham scan

    //// TODO
}